

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

WeakRefValueDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
* __thiscall
Memory::
AllocateArray<Memory::Recycler,JsUtil::WeakRefValueDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>>>,false>
          (Memory *this,Recycler *allocator,offset_in_Recycler_to_subr AllocFunc,size_t count)

{
  undefined1 auVar1 [16];
  WeakRefValueDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
  *pWVar2;
  WeakRefValueDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
  *pWVar3;
  size_t byteSize;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pWVar2 = (WeakRefValueDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
              *)0x8;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x30),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x30),0);
    }
    pWVar2 = (WeakRefValueDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
              *)new__<Memory::Recycler>
                          (byteSize,(Recycler *)this,(offset_in_Recycler_to_subr)allocator);
    pWVar3 = pWVar2;
    do {
      (pWVar3->
      super_SimpleDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      ).
      super_DefaultHashedEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .
      super_KeyValueEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>_>
      .
      super_KeyValueEntryDataLayout2<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      .value.ptr = (RecyclerWeakReference<Js::DynamicType> *)0x0;
      (pWVar3->
      super_SimpleDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      ).
      super_DefaultHashedEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .
      super_KeyValueEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>_>
      .
      super_KeyValueEntryDataLayout2<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      .key.traceCallback = 0;
      (pWVar3->
      super_SimpleDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      ).
      super_DefaultHashedEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .
      super_KeyValueEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>_>
      .
      super_KeyValueEntryDataLayout2<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      .key.finalizeCallback = 0;
      (pWVar3->
      super_SimpleDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      ).
      super_DefaultHashedEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .
      super_KeyValueEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>_>
      .
      super_KeyValueEntryDataLayout2<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      .key.interceptors = 0;
      (pWVar3->
      super_SimpleDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      ).
      super_DefaultHashedEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .
      super_KeyValueEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>_>
      .
      super_KeyValueEntryDataLayout2<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      .key.prototype = 0;
      pWVar3 = pWVar3 + 1;
    } while (pWVar3 != pWVar2 + count);
  }
  return pWVar2;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}